

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

float quick_select_float(float *arr,int n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  float t;
  float t_4;
  
  uVar6 = n - 1;
  iVar5 = (n - ((int)uVar6 >> 0x1f)) + -1 >> 1;
  if (1 < n) {
    iVar7 = 0;
    do {
      uVar11 = iVar7 + 1;
      uVar8 = (ulong)uVar11;
      if (uVar6 == uVar11) {
        fVar1 = arr[iVar7];
        if (arr[(int)uVar6] < fVar1) {
          arr[iVar7] = arr[(int)uVar6];
          arr[(int)uVar6] = fVar1;
        }
        break;
      }
      iVar9 = (int)(iVar7 + uVar6) / 2;
      fVar1 = arr[iVar9];
      if (arr[(int)uVar6] < fVar1) {
        arr[iVar9] = arr[(int)uVar6];
        arr[(int)uVar6] = fVar1;
      }
      fVar1 = arr[iVar7];
      if (arr[(int)uVar6] < fVar1) {
        arr[iVar7] = arr[(int)uVar6];
        arr[(int)uVar6] = fVar1;
      }
      fVar1 = arr[iVar9];
      if (arr[iVar7] < fVar1) {
        arr[iVar9] = arr[iVar7];
        arr[iVar7] = fVar1;
      }
      fVar1 = arr[iVar9];
      arr[iVar9] = arr[(int)uVar11];
      arr[(int)uVar11] = fVar1;
      uVar11 = uVar6;
      while( true ) {
        fVar1 = arr[iVar7];
        uVar8 = (ulong)(int)uVar8;
        do {
          fVar2 = arr[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (fVar2 < fVar1);
        lVar4 = (long)(int)uVar11 + 1;
        do {
          uVar10 = uVar11;
          lVar12 = lVar4;
          fVar3 = arr[lVar12 + -2];
          uVar11 = uVar10 - 1;
          lVar4 = lVar12 + -1;
        } while (fVar1 < fVar3);
        if (lVar12 + -1 <= (long)uVar8) break;
        arr[uVar8] = fVar3;
        arr[lVar12 + -2] = fVar2;
      }
      arr[iVar7] = fVar3;
      arr[lVar12 + -2] = fVar1;
      if ((int)uVar11 <= iVar5) {
        iVar7 = (int)uVar8;
      }
      if (iVar5 < (int)uVar10) {
        uVar6 = uVar10 - 2;
      }
    } while (iVar7 < (int)uVar6);
  }
  return arr[iVar5];
}

Assistant:

static float quick_select_float(float arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}